

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O0

REF_STATUS ref_search_dist3(REF_DBL *a,REF_DBL *b,REF_DBL *c,REF_DBL *p,REF_DBL *distance)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_1c8;
  double local_1b8;
  double local_1b0;
  double local_1a0;
  double local_198;
  double local_188;
  double local_180;
  double local_170;
  double local_168;
  double local_158;
  REF_DBL w;
  REF_DBL va;
  REF_DBL vb;
  REF_DBL d6;
  REF_DBL d5;
  REF_DBL cp [3];
  REF_DBL proj [3];
  REF_DBL v;
  REF_DBL vc;
  REF_DBL d4;
  REF_DBL d3;
  REF_DBL bp [3];
  REF_DBL d2;
  REF_DBL d1;
  REF_DBL ap [3];
  REF_DBL ac [3];
  REF_DBL ab [3];
  REF_DBL *distance_local;
  REF_DBL *p_local;
  REF_DBL *c_local;
  REF_DBL *b_local;
  REF_DBL *a_local;
  
  dVar1 = *b - *a;
  dVar2 = b[1] - a[1];
  dVar3 = b[2] - a[2];
  dVar4 = *c - *a;
  dVar5 = c[1] - a[1];
  dVar6 = c[2] - a[2];
  dVar7 = dVar3 * (p[2] - a[2]) + dVar1 * (*p - *a) + dVar2 * (p[1] - a[1]);
  dVar8 = dVar6 * (p[2] - a[2]) + dVar4 * (*p - *a) + dVar5 * (p[1] - a[1]);
  if ((0.0 < dVar7) || (0.0 < dVar8)) {
    dVar9 = dVar3 * (p[2] - b[2]) + dVar1 * (*p - *b) + dVar2 * (p[1] - b[1]);
    dVar10 = dVar6 * (p[2] - b[2]) + dVar4 * (*p - *b) + dVar5 * (p[1] - b[1]);
    if ((dVar9 < 0.0) || (dVar9 < dVar10)) {
      dVar11 = dVar7 * dVar10 + -(dVar9 * dVar8);
      if (((0.0 < dVar11) || (dVar7 < 0.0)) || (0.0 < dVar9)) {
        dVar12 = dVar3 * (p[2] - c[2]) + dVar1 * (*p - *c) + dVar2 * (p[1] - c[1]);
        dVar13 = dVar6 * (p[2] - c[2]) + dVar4 * (*p - *c) + dVar5 * (p[1] - c[1]);
        if ((dVar13 < 0.0) || (dVar13 < dVar12)) {
          dVar7 = dVar12 * dVar8 + -(dVar7 * dVar13);
          if ((0.0 < dVar7) || ((dVar8 < 0.0 || (0.0 < dVar13)))) {
            dVar8 = dVar9 * dVar13 + -(dVar12 * dVar10);
            if ((0.0 < dVar8) || ((dVar10 - dVar9 < 0.0 || (dVar12 - dVar13 < 0.0)))) {
              if ((dVar8 + dVar7 + dVar11) * 1e+20 <= 0.0) {
                local_1a0 = -((dVar8 + dVar7 + dVar11) * 1e+20);
              }
              else {
                local_1a0 = (dVar8 + dVar7 + dVar11) * 1e+20;
              }
              local_1b0 = dVar7;
              if (dVar7 <= 0.0) {
                local_1b0 = -dVar7;
              }
              if (local_1b0 < local_1a0) {
                dVar9 = dVar7 / (dVar8 + dVar7 + dVar11);
                if ((dVar8 + dVar7 + dVar11) * 1e+20 <= 0.0) {
                  local_1b8 = -((dVar8 + dVar7 + dVar11) * 1e+20);
                }
                else {
                  local_1b8 = (dVar8 + dVar7 + dVar11) * 1e+20;
                }
                local_1c8 = dVar11;
                if (dVar11 <= 0.0) {
                  local_1c8 = -dVar11;
                }
                if (local_1c8 < local_1b8) {
                  dVar11 = dVar11 / (dVar8 + dVar7 + dVar11);
                  dVar1 = dVar11 * dVar4 + dVar9 * dVar1 + *a;
                  dVar2 = dVar11 * dVar5 + dVar9 * dVar2 + a[1];
                  dVar3 = dVar11 * dVar6 + dVar9 * dVar3 + a[2];
                  dVar1 = sqrt((p[2] - dVar3) * (p[2] - dVar3) +
                               (*p - dVar1) * (*p - dVar1) + (p[1] - dVar2) * (p[1] - dVar2));
                  *distance = dVar1;
                  a_local._4_4_ = 0;
                }
                else {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c"
                         ,0x2a3,"ref_search_dist3","div zero vc / (va + vb + vc)");
                  a_local._4_4_ = 1;
                }
              }
              else {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c"
                       ,0x2a1,"ref_search_dist3","div zero vb / (va + vb + vc)");
                a_local._4_4_ = 1;
              }
            }
            else {
              if (((dVar10 - dVar9) + (dVar12 - dVar13)) * 1e+20 <= 0.0) {
                local_188 = -(((dVar10 - dVar9) + (dVar12 - dVar13)) * 1e+20);
              }
              else {
                local_188 = ((dVar10 - dVar9) + (dVar12 - dVar13)) * 1e+20;
              }
              if (dVar10 - dVar9 <= 0.0) {
                local_198 = -(dVar10 - dVar9);
              }
              else {
                local_198 = dVar10 - dVar9;
              }
              if (local_198 < local_188) {
                dVar1 = (dVar10 - dVar9) / ((dVar10 - dVar9) + (dVar12 - dVar13));
                dVar2 = dVar1 * (*c - *b) + *b;
                dVar3 = dVar1 * (c[1] - b[1]) + b[1];
                dVar1 = dVar1 * (c[2] - b[2]) + b[2];
                dVar1 = sqrt((p[2] - dVar1) * (p[2] - dVar1) +
                             (*p - dVar2) * (*p - dVar2) + (p[1] - dVar3) * (p[1] - dVar3));
                *distance = dVar1;
                a_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c"
                       ,0x296,"ref_search_dist3","div zero (d4 - d3) / ((d4 - d3) + (d5 - d6))");
                a_local._4_4_ = 1;
              }
            }
          }
          else {
            if ((dVar8 - dVar13) * 1e+20 <= 0.0) {
              local_170 = -((dVar8 - dVar13) * 1e+20);
            }
            else {
              local_170 = (dVar8 - dVar13) * 1e+20;
            }
            local_180 = dVar8;
            if (dVar8 <= 0.0) {
              local_180 = -dVar8;
            }
            if (local_180 < local_170) {
              dVar8 = dVar8 / (dVar8 - dVar13);
              dVar1 = dVar8 * dVar4 + *a;
              dVar2 = dVar8 * dVar5 + a[1];
              dVar3 = dVar8 * dVar6 + a[2];
              dVar1 = sqrt((p[2] - dVar3) * (p[2] - dVar3) +
                           (*p - dVar1) * (*p - dVar1) + (p[1] - dVar2) * (p[1] - dVar2));
              *distance = dVar1;
              a_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c"
                     ,0x287,"ref_search_dist3","div zero d2/(d2-d6)");
              a_local._4_4_ = 1;
            }
          }
        }
        else {
          dVar1 = sqrt((p[2] - c[2]) * (p[2] - c[2]) +
                       (*p - *c) * (*p - *c) + (p[1] - c[1]) * (p[1] - c[1]));
          *distance = dVar1;
          a_local._4_4_ = 0;
        }
      }
      else {
        if ((dVar7 - dVar9) * 1e+20 <= 0.0) {
          local_158 = -((dVar7 - dVar9) * 1e+20);
        }
        else {
          local_158 = (dVar7 - dVar9) * 1e+20;
        }
        local_168 = dVar7;
        if (dVar7 <= 0.0) {
          local_168 = -dVar7;
        }
        if (local_168 < local_158) {
          dVar7 = dVar7 / (dVar7 - dVar9);
          dVar1 = dVar7 * dVar1 + *a;
          dVar2 = dVar7 * dVar2 + a[1];
          dVar3 = dVar7 * dVar3 + a[2];
          dVar1 = sqrt((p[2] - dVar3) * (p[2] - dVar3) +
                       (*p - dVar1) * (*p - dVar1) + (p[1] - dVar2) * (p[1] - dVar2));
          *distance = dVar1;
          a_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
                 0x26c,"ref_search_dist3","div zero d1/(d1-d3)");
          a_local._4_4_ = 1;
        }
      }
    }
    else {
      dVar1 = sqrt((p[2] - b[2]) * (p[2] - b[2]) +
                   (*p - *b) * (*p - *b) + (p[1] - b[1]) * (p[1] - b[1]));
      *distance = dVar1;
      a_local._4_4_ = 0;
    }
  }
  else {
    dVar1 = sqrt((p[2] - a[2]) * (p[2] - a[2]) +
                 (*p - *a) * (*p - *a) + (p[1] - a[1]) * (p[1] - a[1]));
    *distance = dVar1;
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_search_dist3(REF_DBL *a, REF_DBL *b, REF_DBL *c,
                                    REF_DBL *p, REF_DBL *distance) {
  REF_DBL ab[3], ac[3], ap[3];
  REF_DBL d1, d2;
  REF_DBL bp[3];
  REF_DBL d3, d4;
  REF_DBL vc, v;
  REF_DBL proj[3];
  REF_DBL cp[3];
  REF_DBL d5, d6;
  REF_DBL vb, va;
  REF_DBL w;

  /*
        printf("REF_DBL xyz0[]={%.15e, %.15e, %.15e};\n",a[0],a[1],a[2]);
        printf("REF_DBL xyz1[]={%.15e, %.15e, %.15e};\n",b[0],b[1],b[2]);
        printf("REF_DBL xyz2[]={%.15e, %.15e, %.15e};\n",c[0],c[1],c[2]);
        printf("REF_DBL xyz[]={%.15e, %.15e, %.15e};\n",p[0],p[1],p[2]);
   */

  /* Check if P in vertex region outside A */
  ab[0] = b[0] - a[0];
  ab[1] = b[1] - a[1];
  ab[2] = b[2] - a[2];

  ac[0] = c[0] - a[0];
  ac[1] = c[1] - a[1];
  ac[2] = c[2] - a[2];

  ap[0] = p[0] - a[0];
  ap[1] = p[1] - a[1];
  ap[2] = p[2] - a[2];

  d1 = ab[0] * ap[0] + ab[1] * ap[1] + ab[2] * ap[2];
  d2 = ac[0] * ap[0] + ac[1] * ap[1] + ac[2] * ap[2];
  if (d1 <= 0.0 && d2 <= 0.0) {
    *distance =
        sqrt((p[0] - a[0]) * (p[0] - a[0]) + (p[1] - a[1]) * (p[1] - a[1]) +
             (p[2] - a[2]) * (p[2] - a[2]));
    return REF_SUCCESS;
  }

  /* Check if P in vertex region outside B */
  bp[0] = p[0] - b[0];
  bp[1] = p[1] - b[1];
  bp[2] = p[2] - b[2];

  d3 = ab[0] * bp[0] + ab[1] * bp[1] + ab[2] * bp[2];
  d4 = ac[0] * bp[0] + ac[1] * bp[1] + ac[2] * bp[2];
  if (d3 >= 0.0 && d4 <= d3) {
    *distance =
        sqrt((p[0] - b[0]) * (p[0] - b[0]) + (p[1] - b[1]) * (p[1] - b[1]) +
             (p[2] - b[2]) * (p[2] - b[2]));
    return REF_SUCCESS;
  }

  /* Check if P in edge region of AB, if so return projection of P onto AB */
  vc = d1 * d4 - d3 * d2;
  if (vc <= 0.0 && d1 >= 0.0 && d3 <= 0.0) {
    RAS(ref_math_divisible(d1, (d1 - d3)), "div zero d1/(d1-d3)");
    v = d1 / (d1 - d3);
    proj[0] = a[0] + v * ab[0];
    proj[1] = a[1] + v * ab[1];
    proj[2] = a[2] + v * ab[2];
    *distance = sqrt((p[0] - proj[0]) * (p[0] - proj[0]) +
                     (p[1] - proj[1]) * (p[1] - proj[1]) +
                     (p[2] - proj[2]) * (p[2] - proj[2]));
    return REF_SUCCESS;
  }

  /* Check if P in vertex region outside C */
  cp[0] = p[0] - c[0];
  cp[1] = p[1] - c[1];
  cp[2] = p[2] - c[2];
  d5 = ab[0] * cp[0] + ab[1] * cp[1] + ab[2] * cp[2];
  d6 = ac[0] * cp[0] + ac[1] * cp[1] + ac[2] * cp[2];
  if (d6 >= 0.0 && d5 <= d6) {
    *distance =
        sqrt((p[0] - c[0]) * (p[0] - c[0]) + (p[1] - c[1]) * (p[1] - c[1]) +
             (p[2] - c[2]) * (p[2] - c[2]));
    return REF_SUCCESS;
  }

  /* Check if P in edge region of AC, if so return projection of P onto AC */
  vb = d5 * d2 - d1 * d6;
  if (vb <= 0.0 && d2 >= 0.0 && d6 <= 0.0) {
    RAS(ref_math_divisible(d2, (d2 - d6)), "div zero d2/(d2-d6)");
    v = d2 / (d2 - d6);
    proj[0] = a[0] + v * ac[0];
    proj[1] = a[1] + v * ac[1];
    proj[2] = a[2] + v * ac[2];
    *distance = sqrt((p[0] - proj[0]) * (p[0] - proj[0]) +
                     (p[1] - proj[1]) * (p[1] - proj[1]) +
                     (p[2] - proj[2]) * (p[2] - proj[2]));
    return REF_SUCCESS;
  }

  /* Check if P in edge region of BC, if so return projection of P onto BC */
  va = d3 * d6 - d5 * d4;
  if (va <= 0.0 && (d4 - d3) >= 0.0 && (d5 - d6) >= 0.0) {
    RAS(ref_math_divisible((d4 - d3), ((d4 - d3) + (d5 - d6))),
        "div zero (d4 - d3) / ((d4 - d3) + (d5 - d6))");
    v = (d4 - d3) / ((d4 - d3) + (d5 - d6));
    proj[0] = b[0] + v * (c[0] - b[0]);
    proj[1] = b[1] + v * (c[1] - b[1]);
    proj[2] = b[2] + v * (c[2] - b[2]);
    *distance = sqrt((p[0] - proj[0]) * (p[0] - proj[0]) +
                     (p[1] - proj[1]) * (p[1] - proj[1]) +
                     (p[2] - proj[2]) * (p[2] - proj[2]));
    return REF_SUCCESS;
  }

  RAS(ref_math_divisible(vb, (va + vb + vc)), "div zero vb / (va + vb + vc)");
  v = vb / (va + vb + vc);
  RAS(ref_math_divisible(vc, (va + vb + vc)), "div zero vc / (va + vb + vc)");
  w = vc / (va + vb + vc);
  proj[0] = a[0] + v * ab[0] + w * ac[0];
  proj[1] = a[1] + v * ab[1] + w * ac[1];
  proj[2] = a[2] + v * ab[2] + w * ac[2];
  *distance = sqrt((p[0] - proj[0]) * (p[0] - proj[0]) +
                   (p[1] - proj[1]) * (p[1] - proj[1]) +
                   (p[2] - proj[2]) * (p[2] - proj[2]));

  return REF_SUCCESS;
}